

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint _h;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong _elemsize;
  void *pvVar6;
  int *piVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  Mat *pMVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  void *pvVar22;
  uint uVar23;
  int iVar24;
  void *pvVar25;
  Mat m;
  int _axes [4];
  Mat borderm;
  int local_140;
  int local_13c;
  Mat local_108;
  uint local_bc;
  void *local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  int local_a0;
  Allocator *local_98;
  undefined4 local_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  ulong local_80;
  Mat local_78;
  
  uVar1 = bottom_blob->w;
  _h = bottom_blob->h;
  uVar2 = bottom_blob->c;
  iVar24 = bottom_blob->dims;
  _elemsize = bottom_blob->elemsize;
  iVar11 = this->woffset;
  iVar3 = this->hoffset;
  iVar15 = this->coffset;
  uVar19 = this->woffset2;
  uVar14 = (ulong)uVar19;
  uVar20 = this->hoffset2;
  uVar21 = this->coffset2;
  pvVar22 = (this->starts).data;
  if ((((pvVar22 == (void *)0x0) || ((long)(this->starts).c * (this->starts).cstep == 0)) ||
      (pvVar25 = (this->ends).data, pvVar25 == (void *)0x0)) ||
     ((long)(this->ends).c * (this->ends).cstep == 0)) {
    uVar16 = uVar21;
    if (iVar24 == 1) {
      uVar23 = this->outw;
      uVar16 = (uVar1 - iVar11) - uVar19;
      if ((uVar23 != 0xffffff17) && ((int)uVar23 <= (int)uVar16)) {
        uVar16 = uVar23;
      }
    }
    pMVar18 = bottom_blob;
    uVar23 = uVar20;
    local_140 = iVar11;
    local_13c = iVar3;
    if (iVar24 == 2) {
      uVar17 = this->outw;
      if (iVar3 == -0xe9) {
        uVar16 = _h - (iVar11 + uVar19);
        pMVar18 = (Mat *)(ulong)uVar16;
        uVar14 = 0;
        if ((uVar17 != 0xffffff17) && (pMVar18 = (Mat *)(ulong)uVar16, (int)uVar17 <= (int)uVar16))
        {
          pMVar18 = (Mat *)(ulong)uVar17;
        }
        local_140 = 0;
        uVar16 = uVar1;
        uVar23 = uVar19;
        local_13c = iVar11;
      }
      else {
        uVar13 = uVar1 - (iVar11 + uVar19);
        uVar16 = uVar17;
        if ((int)uVar13 < (int)uVar17) {
          uVar16 = uVar13;
        }
        if (uVar17 == 0xffffff17) {
          uVar16 = uVar13;
        }
        uVar17 = this->outh;
        uVar13 = (_h - iVar3) - uVar20;
        pMVar18 = (Mat *)(ulong)uVar13;
        if ((uVar17 != 0xffffff17) && (pMVar18 = (Mat *)(ulong)uVar13, (int)uVar17 <= (int)uVar13))
        {
          pMVar18 = (Mat *)(ulong)uVar17;
        }
      }
    }
    uVar17 = (uint)pMVar18;
    local_bc = uVar21;
    if (iVar24 != 3) goto LAB_00133b19;
    uVar13 = this->outw;
    if (iVar15 != -0xe9 || local_13c != -0xe9) {
      uVar4 = this->outh;
      if (local_13c == -0xe9) {
        uVar19 = _h - (uVar19 + iVar11);
        uVar17 = uVar13;
        if ((int)uVar19 < (int)uVar13) {
          uVar17 = uVar19;
        }
        if (uVar13 == 0xffffff17) {
          uVar17 = uVar19;
        }
        uVar19 = uVar2 - (uVar20 + iVar3);
        uVar14 = (ulong)uVar19;
        local_140 = 0;
        uVar16 = uVar1;
        local_13c = iVar11;
        iVar15 = iVar3;
        if ((uVar4 != 0xffffff17) && (uVar14 = (ulong)uVar19, (int)uVar4 <= (int)uVar19)) {
          uVar14 = (ulong)uVar4;
        }
      }
      else {
        uVar19 = uVar1 - ((int)uVar14 + local_140);
        uVar16 = uVar13;
        if ((int)uVar19 < (int)uVar13) {
          uVar16 = uVar19;
        }
        if (uVar13 == 0xffffff17) {
          uVar16 = uVar19;
        }
        uVar19 = _h - (uVar23 + local_13c);
        uVar17 = uVar4;
        if ((int)uVar19 < (int)uVar4) {
          uVar17 = uVar19;
        }
        if (uVar4 == 0xffffff17) {
          uVar17 = uVar19;
        }
        uVar19 = this->outc;
        uVar20 = uVar2 - (uVar21 + iVar15);
        uVar14 = (ulong)uVar20;
        if ((uVar19 != 0xffffff17) && (uVar14 = (ulong)uVar20, (int)uVar19 <= (int)uVar20)) {
          uVar14 = (ulong)uVar19;
        }
      }
      goto LAB_00133b19;
    }
    uVar19 = uVar2 - (uVar19 + iVar11);
    uVar14 = (ulong)uVar19;
    if ((uVar13 != 0xffffff17) && (uVar14 = (ulong)uVar19, (int)uVar13 <= (int)uVar19)) {
      uVar14 = (ulong)uVar13;
    }
  }
  else {
    pvVar6 = (this->axes).data;
    local_b8 = (void *)0x100000000;
    uStack_b0 = 2;
    uStack_ac = 3;
    uVar19 = (this->axes).w;
    uVar8 = (ulong)uVar19;
    if (uVar8 == 0) {
      uVar8 = (ulong)(iVar24 + 1);
    }
    else if (0 < (int)uVar19) {
      uVar14 = 0;
      do {
        iVar11 = *(int *)((long)pvVar6 + uVar14 * 4);
        *(uint *)((long)&local_b8 + uVar14 * 4) = (iVar11 >> 0x1f & iVar24 + 1U) + iVar11;
        uVar14 = uVar14 + 1;
      } while (uVar8 != uVar14);
    }
    if (0 < (int)uVar8) {
      uVar10 = 0;
      local_140 = 0;
      local_13c = 0;
      iVar15 = 0;
      uVar14 = (ulong)uVar2;
      uVar16 = uVar1;
      uVar17 = _h;
      do {
        iVar11 = *(int *)((long)&local_b8 + uVar10 * 4);
        if (iVar11 != 0) {
          iVar3 = *(int *)((long)pvVar22 + uVar10 * 4);
          iVar5 = *(int *)((long)pvVar25 + uVar10 * 4);
          uVar19 = iVar3 >> 0x1f;
          if (iVar24 == 1) {
            uVar20 = 0;
            if (iVar5 < 1) {
              uVar20 = uVar1;
            }
            local_140 = (uVar19 & uVar1) + iVar3;
            uVar16 = uVar20 + iVar5;
            if ((int)uVar1 <= (int)(uVar20 + iVar5)) {
              uVar16 = uVar1;
            }
            uVar16 = uVar16 - local_140;
          }
          if (iVar24 == 2) {
            if (iVar11 == 1) {
              uVar20 = 0;
              if (iVar5 < 1) {
                uVar20 = _h;
              }
              local_13c = (uVar19 & _h) + iVar3;
              uVar17 = uVar20 + iVar5;
              if ((int)_h <= (int)(uVar20 + iVar5)) {
                uVar17 = _h;
              }
              uVar17 = uVar17 - local_140;
            }
            if (iVar11 == 2) {
              uVar20 = 0;
              if (iVar5 < 1) {
                uVar20 = uVar1;
              }
              local_140 = (uVar19 & uVar1) + iVar3;
              uVar16 = uVar20 + iVar5;
              if ((int)uVar1 <= (int)(uVar20 + iVar5)) {
                uVar16 = uVar1;
              }
              uVar16 = uVar16 - local_140;
            }
          }
          if (iVar24 == 3) {
            if (iVar11 == 1) {
              uVar20 = 0;
              if (iVar5 < 1) {
                uVar20 = uVar2;
              }
              iVar15 = (uVar19 & uVar2) + iVar3;
              uVar21 = uVar20 + iVar5;
              if ((int)uVar2 <= (int)(uVar20 + iVar5)) {
                uVar21 = uVar2;
              }
              uVar14 = (ulong)(uVar21 - iVar15);
            }
            if (iVar11 == 2) {
              uVar20 = 0;
              if (iVar5 < 1) {
                uVar20 = _h;
              }
              local_13c = (uVar19 & _h) + iVar3;
              uVar17 = uVar20 + iVar5;
              if ((int)_h <= (int)(uVar20 + iVar5)) {
                uVar17 = _h;
              }
              uVar17 = uVar17 - local_140;
            }
            if (iVar11 == 3) {
              uVar20 = 0;
              if (iVar5 < 1) {
                uVar20 = uVar1;
              }
              local_140 = (uVar19 & uVar1) + iVar3;
              uVar16 = uVar20 + iVar5;
              if ((int)uVar1 <= (int)(uVar20 + iVar5)) {
                uVar16 = uVar1;
              }
              uVar16 = uVar16 - local_140;
            }
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
      goto LAB_00133b19;
    }
    iVar11 = 0;
    uVar14 = (ulong)uVar2;
  }
  local_13c = 0;
  local_140 = 0;
  uVar16 = uVar1;
  uVar17 = _h;
  iVar15 = iVar11;
LAB_00133b19:
  if (iVar24 == 3) {
    uVar19 = (uint)uVar14;
    if ((uVar17 != _h || uVar16 != uVar1) || (uVar19 != uVar2)) {
      local_b8 = (void *)((long)iVar15 * _elemsize * bottom_blob->cstep + (long)bottom_blob->data);
      local_a0 = bottom_blob->elempack;
      local_98 = bottom_blob->allocator;
      uStack_b0 = 0;
      uStack_ac = 0;
      local_a8 = (undefined4)_elemsize;
      uStack_a4 = (undefined4)(_elemsize >> 0x20);
      _local_90 = CONCAT44(uVar1,3);
      local_80 = ((long)(int)(_h * uVar1) * _elemsize + 0xf & 0xfffffffffffffff0) / _elemsize;
      uStack_88 = _h;
      uStack_84 = uVar19;
      if (uVar17 != _h || uVar16 != uVar1) {
        Mat::create(top_blob,uVar16,uVar17,uVar19,_elemsize,opt->blob_allocator);
        iVar24 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (0 < (int)uVar19) {
            uVar8 = 0;
            do {
              local_108.data =
                   (void *)(local_80 * uVar8 * CONCAT44(uStack_a4,local_a8) + (long)local_b8);
              local_108.refcount._0_4_ = 0;
              local_108.refcount._4_4_ = 0;
              local_108.elemsize._0_4_ = local_a8;
              local_108.elemsize._4_4_ = uStack_a4;
              local_108.elempack = local_a0;
              local_108.allocator = local_98;
              local_108.w = uStack_8c;
              local_108.dims = 2;
              local_108.c = 1;
              local_108.h = uStack_88;
              local_108.cstep = (size_t)(int)(uStack_88 * uStack_8c);
              uVar1 = top_blob->w;
              iVar24 = top_blob->h;
              sVar9 = top_blob->elemsize;
              pvVar22 = (void *)(top_blob->cstep * uVar8 * sVar9 + (long)top_blob->data);
              local_78.elempack = top_blob->elempack;
              local_78.allocator = top_blob->allocator;
              local_78.refcount._0_4_ = 0;
              local_78.refcount._4_4_ = 0;
              local_78.elemsize._0_4_ = (undefined4)sVar9;
              local_78.elemsize._4_4_ = (undefined4)(sVar9 >> 0x20);
              local_78.w = uVar1;
              local_78.dims = 2;
              local_78.c = 1;
              local_78.h = iVar24;
              local_78.cstep = (size_t)(int)(iVar24 * uVar1);
              local_78.data = pvVar22;
              if (_elemsize == 4) {
                copy_cut_border_image<float>(&local_108,&local_78,local_13c,local_140);
              }
              else if ((_elemsize == 1) && (0 < iVar24)) {
                pvVar25 = (void *)((long)local_108.data +
                                  CONCAT44(uStack_a4,local_a8) * (long)(int)(uStack_8c * local_13c)
                                  + (long)local_140);
                lVar12 = (long)(int)uStack_8c;
                iVar11 = 0;
                do {
                  if ((int)uVar1 < 0xc) {
                    if (0 < (int)uVar1) {
                      uVar10 = 0;
                      do {
                        *(undefined1 *)((long)pvVar22 + uVar10) =
                             *(undefined1 *)((long)pvVar25 + uVar10);
                        uVar10 = uVar10 + 1;
                      } while (uVar1 != uVar10);
                    }
                  }
                  else {
                    memcpy(pvVar22,pvVar25,(ulong)uVar1);
                  }
                  pvVar22 = (void *)((long)pvVar22 + (long)(int)uVar1);
                  pvVar25 = (void *)((long)pvVar25 + lVar12);
                  iVar11 = iVar11 + 1;
                } while (iVar11 != iVar24);
              }
              piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_78.allocator == (Allocator *)0x0) {
                    if (local_78.data != (void *)0x0) {
                      free(local_78.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_78.allocator + 0x18))();
                  }
                }
              }
              local_78.elemsize._0_4_ = 0;
              local_78.elemsize._4_4_ = 0;
              local_78.elempack = 0;
              local_78.data = (void *)0x0;
              local_78.refcount._0_4_ = 0;
              local_78.refcount._4_4_ = 0;
              local_78.dims = 0;
              local_78.w = 0;
              local_78.h = 0;
              local_78.c = 0;
              local_78.cstep = 0;
              piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
              if (piVar7 != (int *)0x0) {
                LOCK();
                *piVar7 = *piVar7 + -1;
                UNLOCK();
                if (*piVar7 == 0) {
                  if (local_108.allocator == (Allocator *)0x0) {
                    if (local_108.data != (void *)0x0) {
                      free(local_108.data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_108.allocator + 0x18))();
                  }
                }
              }
              local_108.elemsize._0_4_ = 0;
              local_108.elemsize._4_4_ = 0;
              local_108.elempack = 0;
              local_108.data = (void *)0x0;
              local_108.refcount._0_4_ = 0;
              local_108.refcount._4_4_ = 0;
              local_108.dims = 0;
              local_108.w = 0;
              local_108.h = 0;
              local_108.c = 0;
              local_108.cstep = 0;
              uVar8 = uVar8 + 1;
            } while (uVar8 != uVar14);
          }
          iVar24 = 0;
        }
      }
      else {
        if ((bottom_blob->data == (void *)0x0) || (local_80 * (long)(int)uVar19 == 0)) {
          local_108.elemsize._0_4_ = 0;
          local_108.elemsize._4_4_ = 0;
          local_108.elempack = 0;
          local_108.data = (void *)0x0;
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.allocator = (Allocator *)0x0;
          local_108.dims = 0;
          local_108.w = 0;
          local_108.h = 0;
          local_108.c = 0;
          local_108.cstep = 0;
        }
        else {
          local_108.elemsize._0_4_ = 0;
          local_108.elemsize._4_4_ = 0;
          local_108.elempack = 0;
          local_108.data = (void *)0x0;
          local_108.refcount._0_4_ = 0;
          local_108.refcount._4_4_ = 0;
          local_108.allocator = (Allocator *)0x0;
          local_108.dims = 0;
          local_108.w = 0;
          local_108.h = 0;
          local_108.c = 0;
          local_108.cstep = 0;
          Mat::create(&local_108,uVar1,_h,uVar19,_elemsize,local_a0,(Allocator *)0x0);
          if ((long)(int)uStack_84 * local_80 != 0) {
            memcpy(local_108.data,local_b8,
                   (long)(int)uStack_84 * local_80 * CONCAT44(uStack_a4,local_a8));
          }
        }
        if (&local_108 != top_blob) {
          piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = top_blob->refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->c = 0;
          top_blob->cstep = 0;
          top_blob->data = local_108.data;
          top_blob->refcount = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
          top_blob->elemsize = CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize);
          top_blob->elempack = local_108.elempack;
          top_blob->allocator = local_108.allocator;
          top_blob->dims = local_108.dims;
          top_blob->w = local_108.w;
          top_blob->h = local_108.h;
          top_blob->c = local_108.c;
          top_blob->cstep = local_108.cstep;
        }
        piVar7 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if (local_108.data != (void *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (**(code **)(*(long *)local_108.allocator + 0x18))();
            }
          }
        }
        if (top_blob->data == (void *)0x0) {
          iVar24 = -100;
        }
        else {
          iVar24 = -100;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            iVar24 = 0;
          }
        }
      }
      piVar7 = (int *)CONCAT44(uStack_ac,uStack_b0);
      if (piVar7 == (int *)0x0) {
        return iVar24;
      }
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 != 0) {
        return iVar24;
      }
      if (local_98 == (Allocator *)0x0) {
        if (local_b8 != (void *)0x0) {
          free(local_b8);
          return iVar24;
        }
        return iVar24;
      }
      (**(code **)(*(long *)local_98 + 0x18))();
      return iVar24;
    }
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar7 = bottom_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar7 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar7;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar24 = bottom_blob->w;
    iVar11 = bottom_blob->h;
    iVar3 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar24;
    top_blob->h = iVar11;
    top_blob->c = iVar3;
    sVar9 = bottom_blob->cstep;
  }
  else {
    if (iVar24 == 2) {
      if ((uVar16 != uVar1) || (uVar17 != _h)) {
        Mat::create(top_blob,uVar16,uVar17,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == 4) {
          copy_cut_border_image<float>(bottom_blob,top_blob,local_13c,local_140);
          return 0;
        }
        if (_elemsize != 1) {
          return 0;
        }
        copy_cut_border_image<signed_char>(bottom_blob,top_blob,local_13c,local_140);
        return 0;
      }
    }
    else {
      if (iVar24 != 1) {
        return 0;
      }
      if (uVar16 != uVar1) {
        Mat::create(top_blob,uVar16,_elemsize,opt->blob_allocator);
        if (top_blob->data == (void *)0x0) {
          return -100;
        }
        if ((long)top_blob->c * top_blob->cstep == 0) {
          return -100;
        }
        if (_elemsize == 4) {
          copy_cut_border_image<float>(bottom_blob,top_blob,0,local_140);
          return 0;
        }
        if (_elemsize == 1) {
          copy_cut_border_image<signed_char>(bottom_blob,top_blob,0,local_140);
          return 0;
        }
        return 0;
      }
    }
    if (top_blob == bottom_blob) {
      return 0;
    }
    piVar7 = bottom_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            free(top_blob->data);
          }
        }
        else {
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
    *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->c = 0;
    top_blob->cstep = 0;
    piVar7 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar7;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar24 = bottom_blob->w;
    iVar11 = bottom_blob->h;
    iVar3 = bottom_blob->c;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar24;
    top_blob->h = iVar11;
    top_blob->c = iVar3;
    sVar9 = bottom_blob->cstep;
  }
  top_blob->cstep = sVar9;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset = woffset;
    int _hoffset = hoffset;
    int _coffset = coffset;
    int _woffset2 = woffset2;
    int _hoffset2 = hoffset2;
    int _coffset2 = coffset2;
    int _outw;
    int _outh;
    int _outc;

    bool numpy_style_slice = !starts.empty() && !ends.empty();
    if (numpy_style_slice)
    {
        _woffset = 0;
        _hoffset = 0;
        _coffset = 0;
        _outw = w;
        _outh = h;
        _outc = channels;

        const int* starts_ptr = starts;
        const int* ends_ptr = ends;
        const int* axes_ptr = axes;

        int _axes[4] = {0,1,2,3};
        int num_axis = axes.w;
        if (num_axis == 0)
        {
            num_axis = dims + 1;// +1 for N-dim
        }
        else
        {
            for (int i=0; i<num_axis; i++)
            {
                int axis = axes_ptr[i];
                if (axis < 0)
                    axis = dims + 1 + axis;// +1 for N-dim
                _axes[i] = axis;
            }
        }

        for (int i=0; i<num_axis; i++)
        {
            int axis = _axes[i];
            if (axis == 0)
                continue;// skip N-dim

            int start = starts_ptr[i];
            int end = ends_ptr[i];

            if (dims == 1) // axis == 1
            {
                _woffset = start >= 0 ? start : w + start;
                _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
            }
            if (dims == 2)
            {
                if (axis == 1)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 2)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
            if (dims == 3)
            {
                if (axis == 1)
                {
                    _coffset = start >= 0 ? start : channels + start;
                    _outc = std::min(channels, end > 0 ? end : channels + end) - _coffset;
                }
                if (axis == 2)
                {
                    _hoffset = start >= 0 ? start : h + start;
                    _outh = std::min(h, end > 0 ? end : h + end) - _woffset;
                }
                if (axis == 3)
                {
                    _woffset = start >= 0 ? start : w + start;
                    _outw = std::min(w, end > 0 ? end : w + end) - _woffset;
                }
            }
        }
    }
    else
    {
        if (dims == 1)
        {
            if (outw == -233)
                _outw = w - _woffset - _woffset2;
            else
                _outw = std::min(outw, w - _woffset - _woffset2);
        }
        if (dims == 2)
        {
            if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);
            }
        }
        if (dims == 3)
        {
            if (_hoffset == -233 && _coffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;
                _hoffset = 0;
                _hoffset2 = 0;
                _outh = h;

                _coffset = woffset;
                _coffset2 = woffset2;

                if (outw == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outw, channels - _coffset - _coffset2);
            }
            else if (_hoffset == -233)
            {
                _woffset = 0;
                _woffset2 = 0;
                _outw = w;

                _hoffset = woffset;
                _hoffset2 = woffset2;

                if (outw == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outw, h - _hoffset - _hoffset2);

                _coffset = hoffset;
                _coffset2 = hoffset2;

                if (outh == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outh, channels - _coffset - _coffset2);
            }
            else
            {
                if (outw == -233)
                    _outw = w - _woffset - _woffset2;
                else
                    _outw = std::min(outw, w - _woffset - _woffset2);

                if (outh == -233)
                    _outh = h - _hoffset - _hoffset2;
                else
                    _outh = std::min(outh, h - _hoffset - _hoffset2);

                if (outc == -233)
                    _outc = channels - _coffset - _coffset2;
                else
                    _outc = std::min(outc, channels - _coffset - _coffset2);
            }
        }
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        else if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            else if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}